

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

void chase_new_line(Source_File *src,Translation_Data *translation_data)

{
  char cVar1;
  
  do {
    cVar1 = src_getc(src,'\x01','\x01','\0');
    if (cVar1 == '\n') break;
  } while (cVar1 != '\0');
  src->where_in_src = src->where_in_src + 1;
  src->which_row = src->which_row + 1;
  src->is_in_the_begining_of_line = '\x01';
  src->which_column = 0;
  return;
}

Assistant:

void chase_new_line(struct Source_File *src,struct Translation_Data *translation_data)
{
	char hold_char;
	for(hold_char=src_getc(src,1,1,0);hold_char!='\n' && hold_char!='\0';
			hold_char=src_getc(src,1,1,0));

	++src->where_in_src;
	++src->which_row;
	src->is_in_the_begining_of_line=1;
	src->which_column=0;


}